

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::addNewMedicine(Shop *this)

{
  ostream *poVar1;
  int quantity;
  int unitPrice;
  string name;
  string expireDate;
  string arrivalDate;
  string companyName;
  Medicine medicine;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  companyName._M_dataplus._M_p = (pointer)&companyName.field_2;
  companyName._M_string_length = 0;
  arrivalDate._M_dataplus._M_p = (pointer)&arrivalDate.field_2;
  arrivalDate._M_string_length = 0;
  companyName.field_2._M_local_buf[0] = '\0';
  arrivalDate.field_2._M_local_buf[0] = '\0';
  expireDate._M_dataplus._M_p = (pointer)&expireDate.field_2;
  expireDate._M_string_length = 0;
  expireDate.field_2._M_local_buf[0] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Medicine Name:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&name);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Medicine Company Name:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&companyName);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Unit Price:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&unitPrice);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Arrival date:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&arrivalDate);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Expire date:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator>>((istream *)&std::cin,(string *)&expireDate);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Quantity:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&quantity);
  Medicine::Medicine(&medicine,
                     (int)(((long)(this->medicineList).
                                  super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->medicineList).
                                 super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x90) + 1,unitPrice,quantity,
                     false,&name,&companyName,&arrivalDate,&expireDate);
  std::vector<Medicine,_std::allocator<Medicine>_>::push_back(&this->medicineList,&medicine);
  poVar1 = std::operator<<((ostream *)&std::cout,"Added Medicine, New Medicines List is:");
  std::endl<char,std::char_traits<char>>(poVar1);
  printMedicines(this);
  Medicine::~Medicine(&medicine);
  std::__cxx11::string::~string((string *)&expireDate);
  std::__cxx11::string::~string((string *)&arrivalDate);
  std::__cxx11::string::~string((string *)&companyName);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void addNewMedicine() {
        string name, companyName, arrivalDate, expireDate;
        int unitPrice, quantity;
        cout << "Enter Medicine Name:" << endl;
        cin >> name;
        cout << "Enter Medicine Company Name:" << endl;
        cin >> companyName;
        cout << "Enter Unit Price:" << endl;
        cin >> unitPrice;
        cout << "Enter Arrival date:" << endl;
        cin >> arrivalDate;
        cout << "Enter Expire date:" << endl;
        cin >> expireDate;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;

        Medicine medicine = Medicine(medicineList.size() + 1, unitPrice, quantity, false, name, companyName,
                                     arrivalDate, expireDate);

        medicineList.push_back(medicine);

        cout << "Added Medicine, New Medicines List is:" << endl;
        printMedicines();
    }